

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QDockAreaLayoutInfo * __thiscall
QDockAreaLayoutInfo::info(QDockAreaLayoutInfo *this,QWidget *widget)

{
  bool bVar1;
  int iVar2;
  QList<QDockAreaLayoutItem> *this_00;
  qsizetype qVar3;
  const_reference pQVar4;
  undefined4 extraout_var;
  QDockAreaLayoutInfo *pQVar5;
  QDockAreaLayoutInfo *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  QDockAreaLayoutInfo *result;
  QDockAreaLayoutItem *item;
  int i;
  qsizetype in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar6;
  
  iVar6 = 0;
  do {
    this_00 = (QList<QDockAreaLayoutItem> *)(long)iVar6;
    qVar3 = QList<QDockAreaLayoutItem>::size(&in_RDI->item_list);
    if (qVar3 <= (long)this_00) {
      return (QDockAreaLayoutInfo *)0x0;
    }
    pQVar4 = QList<QDockAreaLayoutItem>::at(this_00,in_stack_ffffffffffffffb8);
    bVar1 = QDockAreaLayoutItem::skip((QDockAreaLayoutItem *)in_RDI);
    if (!bVar1) {
      if (((in_RDI->tabbed & 1U) != 0) && (in_RSI == (QDockAreaLayoutInfo *)in_RDI->tabBar)) {
        return in_RDI;
      }
      if ((pQVar4->widgetItem != (QLayoutItem *)0x0) &&
         (iVar2 = (*pQVar4->widgetItem->_vptr_QLayoutItem[0xd])(),
         (QDockAreaLayoutInfo *)CONCAT44(extraout_var,iVar2) == in_RSI)) {
        return in_RDI;
      }
      if ((pQVar4->subinfo != (QDockAreaLayoutInfo *)0x0) &&
         (pQVar5 = info(in_RSI,(QWidget *)CONCAT44(iVar6,in_stack_ffffffffffffffe0)),
         pQVar5 != (QDockAreaLayoutInfo *)0x0)) {
        return pQVar5;
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

QDockAreaLayoutInfo *QDockAreaLayoutInfo::info(QWidget *widget)
{
    for (int i = 0; i < item_list.size(); ++i) {
        const QDockAreaLayoutItem &item = item_list.at(i);
        if (item.skip())
            continue;

#if QT_CONFIG(tabbar)
        if (tabbed && widget == tabBar)
            return this;
#endif

        if (item.widgetItem != nullptr && item.widgetItem->widget() == widget)
            return this;

        if (item.subinfo != nullptr) {
            if (QDockAreaLayoutInfo *result = item.subinfo->info(widget))
                return result;
        }
    }

    return nullptr;
}